

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.cpp
# Opt level: O0

int __thiscall CaDiCaL::External::lookahead(External *this)

{
  int iVar1;
  External *in_RDI;
  Internal *unaff_retaddr;
  External *in_stack_00000010;
  int elit;
  int ilit;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  reset_extended(in_RDI);
  update_molten_literals(in_stack_00000010);
  iVar1 = Internal::lookahead(unaff_retaddr);
  if ((iVar1 == 0) || (iVar1 == -0x80000000)) {
    iVar1 = 0;
  }
  else {
    iVar1 = Internal::externalize
                      ((Internal *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
  }
  return iVar1;
}

Assistant:

int External::lookahead () {
  reset_extended ();
  update_molten_literals ();
  int ilit = internal->lookahead ();
  const int elit =
      (ilit && ilit != INT_MIN) ? internal->externalize (ilit) : 0;
  LOG ("lookahead internal %d external %d", ilit, elit);
  return elit;
}